

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

int __thiscall moira::Moira::disassemble(Moira *this,char *str,u32 addr)

{
  LetterCase LVar1;
  uint uVar2;
  int iVar3;
  code *pcVar4;
  ulong uVar5;
  long *plVar6;
  char *pcVar7;
  u32 pc;
  StrWriter writer;
  u32 local_5c;
  StrWriter local_58;
  
  local_5c = addr;
  uVar2 = (*this->_vptr_Moira[6])(this,(ulong)addr);
  local_58.style = &this->instrStyle;
  local_58.tab.raw = 8;
  local_58.comment[0] = '\0';
  uVar5 = (ulong)((uVar2 & 0xffff) << 4);
  pcVar4 = *(code **)((long)this->dasm + uVar5);
  plVar6 = (long *)((long)&this->_vptr_Moira + *(long *)((long)this->dasm + uVar5 + 8));
  if (((ulong)pcVar4 & 1) != 0) {
    pcVar4 = *(code **)(pcVar4 + *plVar6 + -1);
  }
  local_58.base = str;
  local_58.ptr = str;
  (*pcVar4)(plVar6,&local_58,&local_5c);
  StrWriter::operator<<(&local_58);
  LVar1 = (this->instrStyle).letterCase;
  pcVar7 = local_58.base;
  if (LVar1 == UPPER_CASE) {
    for (; pcVar7 < local_58.ptr; pcVar7 = pcVar7 + 1) {
      iVar3 = toupper((int)*pcVar7);
      *pcVar7 = (char)iVar3;
    }
  }
  else if (LVar1 == LOWER_CASE) {
    for (; pcVar7 < local_58.ptr; pcVar7 = pcVar7 + 1) {
      iVar3 = tolower((int)*pcVar7);
      *pcVar7 = (char)iVar3;
    }
  }
  return (local_5c - addr) + 2;
}

Assistant:

int
Moira::disassemble(char *str, u32 addr) const
{
    if constexpr (MOIRA_ENABLE_DASM == false) {
        throw std::runtime_error("This feature requires MOIRA_ENABLE_DASM = true\n");
    }

    u32 pc = addr;
    u16 opcode = read16Dasm(pc);

    StrWriter writer(str, instrStyle);

    (this->*dasm[opcode])(writer, pc, opcode);
    writer << Finish{};

    // Post process disassembler output
    switch (instrStyle.letterCase) {

        case LetterCase::MIXED_CASE:

            break;

        case LetterCase::LOWER_CASE:

            for (auto p = writer.base; p < writer.ptr; p++) {
                *p = char(std::tolower(*p));
            }
            break;

        case LetterCase::UPPER_CASE:

            for (auto p = writer.base; p < writer.ptr; p++) {
                *p = char(std::toupper(*p));
            }
            break;
    }

    return pc - addr + 2;
}